

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareBoilerplateShader
          (GPUShaderFP64Test2 *this,GLchar *stage_specific_layout,GLchar *stage_specific_main_body,
          string *out_source_code)

{
  size_t search_position;
  string string;
  size_t local_50;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "#version 400 core\n\nprecision highp float;\n\nSTAGE_SPECIFIC_LAYOUTvoid main()\n{\nSTAGE_SPECIFIC_MAIN_BODY}\n\n"
             ,(allocator<char> *)&local_50);
  local_50 = 0;
  Utils::replaceToken("STAGE_SPECIFIC_LAYOUT",&local_50,stage_specific_layout,&local_48);
  Utils::replaceToken("STAGE_SPECIFIC_MAIN_BODY",&local_50,stage_specific_main_body,&local_48);
  std::__cxx11::string::_M_assign((string *)out_source_code);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareBoilerplateShader(const glw::GLchar* stage_specific_layout,
												  const glw::GLchar* stage_specific_main_body,
												  std::string&		 out_source_code) const
{
	/* Shader template */
	static const glw::GLchar* boilerplate_shader_template_code = "#version 400 core\n"
																 "\n"
																 "precision highp float;\n"
																 "\n"
																 "STAGE_SPECIFIC_LAYOUT"
																 "void main()\n"
																 "{\n"
																 "STAGE_SPECIFIC_MAIN_BODY"
																 "}\n"
																 "\n";

	std::string string = boilerplate_shader_template_code;

	/* Tokens */
	static const glw::GLchar* body_token   = "STAGE_SPECIFIC_MAIN_BODY";
	static const glw::GLchar* layout_token = "STAGE_SPECIFIC_LAYOUT";

	size_t search_position = 0;

	/* Replace tokens */
	Utils::replaceToken(layout_token, search_position, stage_specific_layout, string);
	Utils::replaceToken(body_token, search_position, stage_specific_main_body, string);

	/* Store resuls */
	out_source_code = string;
}